

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBSCAN.cpp
# Opt level: O0

float __thiscall DBSCAN::GetDistance(DBSCAN *this,Embedding *emb1,Embedding *emb2)

{
  float fVar1;
  reference pvVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 local_d8 [4];
  float distance;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  vector<float,_std::allocator<float>_> local_68;
  vector<float,_std::allocator<float>_> local_50;
  ulong local_38;
  size_t i;
  float local_28;
  float f1f2dis;
  float f2dis;
  float f1dis;
  Embedding *emb2_local;
  Embedding *emb1_local;
  DBSCAN *this_local;
  
  f1f2dis = 0.0;
  local_28 = 0.0;
  i._4_4_ = 0.0;
  _f2dis = emb2;
  emb2_local = emb1;
  emb1_local = (Embedding *)this;
  for (local_38 = 0; local_38 < 0x200; local_38 = local_38 + 1) {
    Embedding::GetEmb(&local_50,emb1);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_50,local_38);
    fVar1 = *pvVar2;
    Embedding::GetEmb(&local_68,emb2);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_68,local_38);
    i._4_4_ = fVar1 * *pvVar2 + i._4_4_;
    std::vector<float,_std::allocator<float>_>::~vector(&local_68);
    std::vector<float,_std::allocator<float>_>::~vector(&local_50);
    Embedding::GetEmb(&local_90,emb1);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_90,local_38);
    fVar1 = *pvVar2;
    Embedding::GetEmb(&local_a8,emb1);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_a8,local_38);
    f1f2dis = fVar1 * *pvVar2 + f1f2dis;
    std::vector<float,_std::allocator<float>_>::~vector(&local_a8);
    std::vector<float,_std::allocator<float>_>::~vector(&local_90);
    Embedding::GetEmb(&local_c0,emb2);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_c0,local_38);
    fVar1 = *pvVar2;
    Embedding::GetEmb((vector<float,_std::allocator<float>_> *)local_d8,emb2);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_d8,local_38);
    local_28 = fVar1 * *pvVar2 + local_28;
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_d8);
    std::vector<float,_std::allocator<float>_>::~vector(&local_c0);
  }
  dVar3 = (double)i._4_4_;
  dVar4 = sqrt((double)f1f2dis);
  dVar5 = sqrt((double)local_28);
  return (float)(dVar3 / (dVar4 * dVar5));
}

Assistant:

float DBSCAN::GetDistance(Embedding emb1, Embedding emb2)
{
    float f1dis = 0;
    float f2dis = 0;
    float f1f2dis = 0;
    for (size_t i = 0; i < EMB_SIZE; i++)
    {
        f1f2dis += (float)emb1.GetEmb()[i] * (float)emb2.GetEmb()[i];
        f1dis += (float)emb1.GetEmb()[i] * (float)emb1.GetEmb()[i];
        f2dis += (float)emb2.GetEmb()[i] * (float)emb2.GetEmb()[i];
    }

    float distance = f1f2dis / (sqrt(f1dis) * sqrt(f2dis));
    return distance;        //开方并返回距离
}